

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestSuite test;
  string local_d0;
  test_func local_b0;
  test_func local_90;
  TestSuite local_70;
  
  TestSuite::TestSuite(&local_70,argc,argv);
  local_70.options.printTestMessage = true;
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"multi thread test","");
  local_90.super__Function_base._M_functor._8_8_ = 0;
  local_90.super__Function_base._M_functor._M_unused._M_object = MT_basic_insert_test;
  local_90._M_invoker = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_90.super__Function_base._M_manager = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&local_70,&local_d0,&local_90);
  if (local_90.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_90.super__Function_base._M_manager)
              ((_Any_data *)&local_90,(_Any_data *)&local_90,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"function latency macro test","");
  local_b0.super__Function_base._M_functor._8_8_ = 0;
  local_b0.super__Function_base._M_functor._M_unused._M_object = latency_macro_test;
  local_b0._M_invoker = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_b0.super__Function_base._M_manager = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&local_70,&local_d0,&local_b0);
  if (local_b0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b0.super__Function_base._M_manager)
              ((_Any_data *)&local_b0,(_Any_data *)&local_b0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  TestSuite::~TestSuite(&local_70);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite test(argc, argv);;

    test.options.printTestMessage = true;
    test.doTest("multi thread test", MT_basic_insert_test);
    test.doTest("function latency macro test", latency_macro_test);

    return 0;
}